

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

string * cmCTest::SafeBuildIdField(string *__return_storage_ptr__,string *value)

{
  bool bVar1;
  long lVar2;
  cmXMLSafe local_88;
  string local_70;
  char local_4a [2];
  size_t sStack_48;
  char replace [2];
  size_type n;
  size_type i;
  char *disallowed;
  string *value_local;
  string *safevalue;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  bVar1 = std::operator!=(__return_storage_ptr__,"");
  if (bVar1) {
    lVar2 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0xa4d7cb);
    if (lVar2 != -1) {
      sStack_48 = strlen("\\:*?\"<>|\n\r\t\f\v");
      local_4a[1] = 0;
      for (n = 0; n < sStack_48; n = n + 1) {
        local_4a[0] = "\\:*?\"<>|\n\r\t\f\v"[n];
        cmsys::SystemTools::ReplaceString(__return_storage_ptr__,local_4a,"");
      }
    }
    cmXMLSafe::cmXMLSafe(&local_88,__return_storage_ptr__);
    cmXMLSafe::str_abi_cxx11_(&local_70,&local_88);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  bVar1 = std::operator==(__return_storage_ptr__,"");
  if (bVar1) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"(empty)");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::SafeBuildIdField(const std::string& value)
{
  std::string safevalue(value);

  if (safevalue != "")
    {
    // Disallow non-filename and non-space whitespace characters.
    // If they occur, replace them with ""
    //
    const char *disallowed = "\\:*?\"<>|\n\r\t\f\v";

    if (safevalue.find_first_of(disallowed) != value.npos)
      {
      std::string::size_type i = 0;
      std::string::size_type n = strlen(disallowed);
      char replace[2];
      replace[1] = 0;

      for (i= 0; i<n; ++i)
        {
        replace[0] = disallowed[i];
        cmSystemTools::ReplaceString(safevalue, replace, "");
        }
      }

    safevalue = cmXMLSafe(safevalue).str();
    }

  if (safevalue == "")
    {
    safevalue = "(empty)";
    }

  return safevalue;
}